

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O2

object_ptr __thiscall
mjs::make_accessor_object(mjs *this,gc_heap_ptr<mjs::global_object> *global,value *get,value *set)

{
  string *args;
  uint __line;
  bool bVar1;
  gc_heap_ptr_untyped *pgVar2;
  void *pvVar3;
  long *plVar4;
  long *plVar5;
  undefined8 extraout_RDX;
  char *__assertion;
  object_ptr oVar6;
  value local_68;
  gc_heap_ptr_untyped local_40;
  
  if (get->type_ != undefined) {
    if (get->type_ == object) {
      pgVar2 = &value::object_value(get)->super_gc_heap_ptr_untyped;
      bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>(pgVar2);
      if (bVar1) goto LAB_00146a5d;
    }
    __assertion = 
    "get.type() == value_type::undefined || (get.type() == value_type::object && get.object_value().has_type<function_object>())"
    ;
    __line = 0xb;
    goto LAB_00146c31;
  }
LAB_00146a5d:
  bVar1 = true;
  if (set->type_ == undefined) {
LAB_00146a8e:
    if ((get->type_ != undefined) || (!bVar1)) {
      pvVar3 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      args = *(string **)((long)pvVar3 + 8);
      plVar4 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar4 + 0x98))(&local_68,plVar4,"Accessor");
      local_40.heap_ = (gc_heap *)0x0;
      gc_heap::make<mjs::object,mjs::string,decltype(nullptr)>
                ((gc_heap *)this,args,(void **)&local_68);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_68);
      plVar4 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
      plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar5 + 0x98))(&local_68,plVar5,"get");
      (**(code **)(*plVar4 + 8))(plVar4,&local_68,get,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_68);
      plVar4 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
      plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar5 + 0x98))(&local_68,plVar5,"set");
      (**(code **)(*plVar4 + 8))(plVar4,&local_68,set,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_68);
      plVar4 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
      plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar5 + 0x98))(&local_40,plVar5,"__strict__");
      pvVar3 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      local_68.field_1.b_ = (bool)**(undefined1 **)((long)pvVar3 + 0x28);
      local_68.type_ = boolean;
      (**(code **)(*plVar4 + 8))(plVar4,&local_40,&local_68,0);
      value::~value(&local_68);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
      oVar6.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
      oVar6.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
      return (object_ptr)oVar6.super_gc_heap_ptr_untyped;
    }
    __assertion = "get.type() != value_type::undefined || set.type() != value_type::undefined";
    __line = 0xd;
  }
  else {
    if (set->type_ == object) {
      pgVar2 = &value::object_value(set)->super_gc_heap_ptr_untyped;
      bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>(pgVar2);
      if (bVar1) {
        bVar1 = set->type_ == undefined;
        goto LAB_00146a8e;
      }
    }
    __assertion = 
    "set.type() == value_type::undefined || (set.type() == value_type::object && set.object_value().has_type<function_object>())"
    ;
    __line = 0xc;
  }
LAB_00146c31:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                ,__line,
                "object_ptr mjs::make_accessor_object(const gc_heap_ptr<global_object> &, const value &, const value &)"
               );
}

Assistant:

object_ptr make_accessor_object(const gc_heap_ptr<global_object>& global, const value& get, const value& set) {
    assert(get.type() == value_type::undefined || (get.type() == value_type::object && get.object_value().has_type<function_object>()));
    assert(set.type() == value_type::undefined || (set.type() == value_type::object && set.object_value().has_type<function_object>()));
    assert(get.type() != value_type::undefined || set.type() != value_type::undefined);

    auto a = global->heap().make<object>(global->common_string("Accessor"), nullptr);
    a->put(global->common_string("get"), get);
    a->put(global->common_string("set"), set);
    a->put(global->common_string("__strict__"), value{global->strict_mode()}); // Hack
    return a;
}